

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O0

bool __thiscall
jrtplib::RTCPSDESInfo::GetPrivateValue
          (RTCPSDESInfo *this,uint8_t *prefix,size_t prefixlen,uint8_t **value,size_t *valuelen)

{
  int iVar1;
  reference ppSVar2;
  uint8_t *puVar3;
  bool local_69;
  size_t local_60;
  size_t l;
  uint8_t *p;
  _List_node_base *local_48;
  byte local_39;
  const_iterator cStack_38;
  bool found;
  const_iterator it;
  size_t *valuelen_local;
  uint8_t **value_local;
  size_t prefixlen_local;
  uint8_t *prefix_local;
  RTCPSDESInfo *this_local;
  
  it._M_node = (_List_node_base *)valuelen;
  std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::_List_const_iterator
            (&stack0xffffffffffffffc8);
  local_39 = 0;
  local_48 = (_List_node_base *)
             std::__cxx11::
             list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
             ::begin(&this->privitems);
  cStack_38 = (const_iterator)local_48;
  while( true ) {
    local_69 = false;
    if ((local_39 & 1) == 0) {
      p = (uint8_t *)
          std::__cxx11::
          list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
          ::end(&this->privitems);
      local_69 = std::operator!=(&stack0xffffffffffffffc8,(_Self *)&p);
    }
    if (local_69 == false) break;
    ppSVar2 = std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator*
                        (&stack0xffffffffffffffc8);
    l = (size_t)SDESPrivateItem::GetPrefix(*ppSVar2,&local_60);
    if (local_60 == prefixlen) {
      if (local_60 == 0) {
        local_39 = 1;
      }
      else {
        iVar1 = memcmp(prefix,(void *)l,local_60);
        if (iVar1 == 0) {
          local_39 = 1;
        }
        else {
          std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator++
                    (&stack0xffffffffffffffc8);
        }
      }
    }
    else {
      std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator++
                (&stack0xffffffffffffffc8);
    }
  }
  if ((local_39 & 1) != 0) {
    ppSVar2 = std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator*
                        (&stack0xffffffffffffffc8);
    puVar3 = SDESItem::GetInfo(&(*ppSVar2)->super_SDESItem,(size_t *)it._M_node);
    *value = puVar3;
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool RTCPSDESInfo::GetPrivateValue(const uint8_t *prefix,size_t prefixlen,uint8_t **value,size_t *valuelen) const
{
	std::list<SDESPrivateItem *>::const_iterator it;
	bool found;
	
	found = false;
	it = privitems.begin();
	while (!found && it != privitems.end())
	{
		uint8_t *p;
		size_t l;
		
		p = (*it)->GetPrefix(&l);
		if (l == prefixlen)
		{
			if (l <= 0)
				found = true;
			else if (memcmp(prefix,p,l) == 0)
				found = true;
			else
				++it;
		}
		else
			++it;
	}
	if (found)
		*value = (*it)->GetInfo(valuelen);
	return found;
}